

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.cpp
# Opt level: O3

Variable __thiscall LiteScript::_Type_BOOLEAN::Convert(_Type_BOOLEAN *this,Variable *obj,Type *type)

{
  undefined1 uVar1;
  bool bVar2;
  Object *pOVar3;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *extraout_RDX_02;
  uint *extraout_RDX_03;
  Variable *res;
  Variable VVar5;
  String local_68;
  string local_48;
  uint *puVar4;
  
  bVar2 = Type::operator==(in_RCX,(Type *)_type_boolean);
  if (bVar2) {
    pOVar3 = Variable::operator->((Variable *)type);
    Memory::Create((Memory *)this,(Type *)pOVar3->memory);
    pOVar3 = Variable::operator->((Variable *)type);
    uVar1 = *pOVar3->data;
    pOVar3 = Variable::operator->((Variable *)this);
    *(undefined1 *)pOVar3->data = uVar1;
    puVar4 = extraout_RDX;
  }
  else {
    bVar2 = Type::operator==(in_RCX,(Type *)_type_number);
    if (bVar2) {
      pOVar3 = Variable::operator->((Variable *)type);
      Memory::Create((Memory *)this,(Type *)pOVar3->memory);
      pOVar3 = Variable::operator->((Variable *)type);
      Number::Number((Number *)&local_68,(uint)*pOVar3->data);
      pOVar3 = Variable::operator->((Variable *)this);
      Number::operator=((Number *)pOVar3->data,(Number *)&local_68);
      puVar4 = extraout_RDX_00;
    }
    else {
      bVar2 = Type::operator==(in_RCX,(Type *)_type_string);
      pOVar3 = Variable::operator->((Variable *)type);
      if (bVar2) {
        Memory::Create((Memory *)this,(Type *)pOVar3->memory);
        Variable::operator_cast_to_string(&local_48,(Variable *)type);
        String::String(&local_68,&local_48);
        pOVar3 = Variable::operator->((Variable *)this);
        String::operator=((String *)pOVar3->data,&local_68);
        puVar4 = extraout_RDX_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
             *)local_68.str._M_dataplus._M_p != &local_68.str.field_2) {
          operator_delete(local_68.str._M_dataplus._M_p);
          puVar4 = extraout_RDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
          puVar4 = extraout_RDX_03;
        }
      }
      else {
        VVar5 = Memory::Create((Memory *)this,(Type *)pOVar3->memory);
        puVar4 = VVar5.nb_ref;
      }
    }
  }
  VVar5.nb_ref = puVar4;
  VVar5.obj = (Object *)this;
  return VVar5;
}

Assistant:

LiteScript::Variable LiteScript::_Type_BOOLEAN::Convert(const LiteScript::Variable& obj, const LiteScript::Type& type) const {
    if (type == Type::BOOLEAN) {
        Variable res = obj->memory.Create(Type::BOOLEAN);
        res->GetData<bool>() = obj->GetData<bool>();
        return res;
    }
    else if (type == Type::NUMBER) {
        Variable res = obj->memory.Create(Type::NUMBER);
        res->GetData<Number>() = Number(obj->GetData<bool>() ? 1 : 0);
        return res;
    }
    else if (type == Type::STRING) {
        Variable res = obj->memory.Create(Type::STRING);
        res->GetData<String>() = String((std::string)(obj));
        return res;
    }
    else {
        return obj->memory.Create(Type::NIL);
    }
}